

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhistory.cc
# Opt level: O3

void __thiscall
bdHistory::addMsg(bdHistory *this,bdId *id,bdToken *param_2,uint32_t msgType,bool incoming,
                 bdNodeId *aboutId)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  in_port_t iVar5;
  in_addr iVar6;
  time_t ts;
  mapped_type *this_00;
  bdNodeId bStack_8f;
  undefined3 uStack_7b;
  pair<long,_MsgRegister> local_78;
  
  ts = time((time_t *)0x0);
  this_00 = std::
            map<bdId,_bdMsgHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdMsgHistoryList>_>_>
            ::operator[](&this->mHistory,id);
  iVar5 = (id->addr).sin_port;
  iVar6.s_addr = (id->addr).sin_addr.s_addr;
  uVar2 = *(undefined8 *)(id->addr).sin_zero;
  uVar3 = *(undefined8 *)(id->id).data;
  uVar4 = *(undefined8 *)((id->id).data + 8);
  (this_00->mId).addr.sin_family = (id->addr).sin_family;
  (this_00->mId).addr.sin_port = iVar5;
  (this_00->mId).addr.sin_addr = (in_addr)iVar6.s_addr;
  *(undefined8 *)(this_00->mId).addr.sin_zero = uVar2;
  *(undefined8 *)(this_00->mId).id.data = uVar3;
  *(undefined8 *)((this_00->mId).id.data + 8) = uVar4;
  *(undefined4 *)((this_00->mId).id.data + 0x10) = *(undefined4 *)((id->id).data + 0x10);
  bdMsgHistoryList::addMsg(this_00,ts,msgType,incoming,aboutId);
  uVar1 = *(undefined4 *)((id->id).data + 0x10);
  local_78.second.id.addr.sin_family = (id->addr).sin_family;
  local_78.second.id.addr.sin_port = (id->addr).sin_port;
  local_78.second.id.addr.sin_addr.s_addr = (id->addr).sin_addr.s_addr;
  local_78.second.id.addr.sin_zero = *&(id->addr).sin_zero;
  local_78.second.id.id.data._0_8_ = *(undefined8 *)(id->id).data;
  local_78.second.id.id.data._8_8_ = *(undefined8 *)((id->id).data + 8);
  if (aboutId == (bdNodeId *)0x0) {
    bdStdZeroNodeId(&bStack_8f);
  }
  else {
    bStack_8f.data._16_4_ = *(undefined4 *)(aboutId->data + 0x10);
    bStack_8f.data._0_7_ = SUB87(*(undefined8 *)aboutId->data,0);
    bStack_8f.data[7] = (uchar)((ulong)*(undefined8 *)aboutId->data >> 0x38);
    bStack_8f.data._8_7_ = SUB87(*(undefined8 *)(aboutId->data + 8),0);
    bStack_8f.data[0xf] = (uchar)((ulong)*(undefined8 *)(aboutId->data + 8) >> 0x38);
  }
  local_78.second.msgType = msgType;
  local_78.second.id.id.data._16_4_ = uVar1;
  local_78.second.aboutId.data[0] = bStack_8f.data[0];
  local_78.second.aboutId.data[1] = bStack_8f.data[1];
  local_78.second.aboutId.data[2] = bStack_8f.data[2];
  local_78.second.aboutId.data[3] = bStack_8f.data[3];
  local_78.second.aboutId.data[4] = bStack_8f.data[4];
  local_78.second.aboutId.data[5] = bStack_8f.data[5];
  local_78.second.aboutId.data[6] = bStack_8f.data[6];
  local_78.second.incoming = incoming;
  local_78.second.aboutId.data[8] = bStack_8f.data[8];
  local_78.second.aboutId.data[9] = bStack_8f.data[9];
  local_78.second.aboutId.data[10] = bStack_8f.data[10];
  local_78.second.aboutId.data[0xb] = bStack_8f.data[0xb];
  local_78.second.aboutId.data[0xc] = bStack_8f.data[0xc];
  local_78.second.aboutId.data[0xd] = bStack_8f.data[0xd];
  local_78.second.aboutId.data[0xe] = bStack_8f.data[0xe];
  local_78.second.aboutId.data[7] = bStack_8f.data[7];
  local_78.second.aboutId.data[0x10] = bStack_8f.data[0x10];
  local_78.second.aboutId.data[0x11] = bStack_8f.data[0x11];
  local_78.second.aboutId.data[0x12] = bStack_8f.data[0x12];
  local_78.second.aboutId.data[0x13] = bStack_8f.data[0x13];
  local_78.second.aboutId.data[0xf] = bStack_8f.data[0xf];
  local_78.second._61_3_ = uStack_7b;
  local_78.first = ts;
  std::
  _Rb_tree<long,std::pair<long_const,MsgRegister>,std::_Select1st<std::pair<long_const,MsgRegister>>,std::less<long>,std::allocator<std::pair<long_const,MsgRegister>>>
  ::_M_emplace_equal<std::pair<long,MsgRegister>>
            ((_Rb_tree<long,std::pair<long_const,MsgRegister>,std::_Select1st<std::pair<long_const,MsgRegister>>,std::less<long>,std::allocator<std::pair<long_const,MsgRegister>>>
              *)&this->mMsgTimeline,&local_78);
  return;
}

Assistant:

void bdHistory::addMsg(const bdId *id, bdToken * /*transId*/, uint32_t msgType, bool incoming, const bdNodeId *aboutId) {
	//std::cerr << "bdHistory::addMsg() ";
	//bdStdPrintId(std::cerr, id);
	//std::cerr << std::endl;

	time_t now = time(NULL);

	std::map<bdId, bdMsgHistoryList>::iterator it;
	bdMsgHistoryList &histRef = mHistory[*id]; /* will instaniate empty */
	histRef.mId = *id;
	histRef.addMsg(now, msgType, incoming, aboutId);

	/* add to mMsgTimeline */
	mMsgTimeline.insert(std::make_pair(now, MsgRegister(id, msgType, incoming, aboutId)));
}